

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

void __thiscall mp::BinaryReadError::~BinaryReadError(BinaryReadError *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  *(undefined ***)&(this->super_Error).super_RuntimeError = &PTR__BinaryReadError_0015abf8;
  pcVar2 = (this->filename_)._M_dataplus._M_p;
  paVar1 = &(this->filename_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  fmt::SystemError::~SystemError((RuntimeError *)this);
  return;
}

Assistant:

~BinaryReadError() throw() {}